

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

endpoint_type * __thiscall
asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
          (basic_socket<asio::ip::tcp,_asio::any_io_executor> *this)

{
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RSI;
  error_code *in_RDI;
  implementation_type *unaff_retaddr;
  reactive_socket_service<asio::ip::tcp> *in_stack_00000008;
  error_code ec;
  endpoint_type *ep;
  char *in_stack_ffffffffffffffb8;
  error_code *ec_00;
  
  ec_00 = in_RDI;
  std::error_code::error_code((error_code *)in_RSI);
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_service(in_RSI);
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(in_RSI);
  detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
            (in_stack_00000008,unaff_retaddr,ec_00);
  detail::throw_error((error_code *)in_RSI,in_stack_ffffffffffffffb8);
  return (endpoint_type *)in_RDI;
}

Assistant:

endpoint_type remote_endpoint() const
  {
    asio::error_code ec;
    endpoint_type ep = impl_.get_service().remote_endpoint(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "remote_endpoint");
    return ep;
  }